

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cpp
# Opt level: O2

void applyPatches(Section *section,void *arg)

{
  int iVar1;
  Section **ppSVar2;
  Patch *patch;
  Patch *pPVar3;
  uint8_t i;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  Section *pSVar9;
  char *pcVar10;
  ulong uVar11;
  
  if (section->type == SECTTYPE_INVALID) {
    __assert_fail("type != SECTTYPE_INVALID",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/include/linkdefs.hpp"
                  ,0x65,"bool sect_HasData(enum SectionType)");
  }
  pSVar9 = section;
  if ((section->type & ~SECTTYPE_VRAM) == SECTTYPE_ROMX) {
    do {
      if (beVerbose == true) {
        fprintf(_stderr,"Patching section \"%s\"...\n",pSVar9->name);
      }
      for (uVar6 = 0; uVar6 < pSVar9->nbPatches; uVar6 = uVar6 + 1) {
        pPVar3 = pSVar9->patches;
        patch = pPVar3 + uVar6;
        uVar4 = computeRPNExpr(patch,pSVar9->fileSymbols);
        uVar11 = (ulong)(ushort)(pSVar9->offset + (short)pPVar3[uVar6].offset);
        if ((ulong)pPVar3[uVar6].type == 3) {
          iVar8 = uVar4 - (ushort)(patch->pcSection->org + (short)patch->pcOffset);
          iVar1 = iVar8 + -2;
          if ((isError == false) && (0xff < (ushort)((short)iVar8 + 0x7eU))) {
            error(patch->src,patch->lineNo,"jr target out of reach (expected -129 < %d < 128)",
                  (ulong)(uint)(int)(short)iVar1);
          }
          section->data[uVar11] = (uint8_t)iVar1;
        }
        else {
          if (isError == false) {
            lVar7 = (ulong)pPVar3[uVar6].type * 0xc;
            if (((int)uVar4 < *(int *)(&DAT_0010c954 + lVar7)) ||
               (*(int *)(&DAT_0010c958 + lVar7) < (int)uVar4)) {
              pcVar10 = "";
              if ((int)uVar4 < 0) {
                pcVar10 = " (maybe negative?)";
              }
              error(patch->src,patch->lineNo,"Value %d%s is not %u-bit",(ulong)uVar4,pcVar10,
                    (ulong)(byte)(&DAT_0010c950)[lVar7] << 3);
            }
          }
          for (uVar5 = 0; uVar5 < (byte)(&DAT_0010c950)[(ulong)patch->type * 0xc]; uVar5 = uVar5 + 1
              ) {
            section->data[uVar5 + uVar11] = (uint8_t)uVar4;
            uVar4 = (int)uVar4 >> 8;
          }
        }
      }
      ppSVar2 = &pSVar9->nextu;
      pSVar9 = *ppSVar2;
    } while (*ppSVar2 != (Section *)0x0);
  }
  return;
}

Assistant:

static void applyPatches(struct Section *section, void *arg)
{
	if (!sect_HasData(section->type))
		return;

	(void)arg;
	struct Section *dataSection = section;

	do {
		applyFilePatches(section, dataSection);
		section = section->nextu;
	} while (section);
}